

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator::generateTypeInfo(Generator *this,QByteArray *typeName,bool allowEmptyName)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *valueString;
  int type;
  QByteArray *in_stack_ffffffffffffffb8;
  FILE *__stream;
  uint local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isBuiltinType(in_stack_ffffffffffffffb8);
  if (bVar2) {
    bVar2 = ::operator==((QByteArray *)&DAT_aaaaaaaaaaaaaaaa,(char **)in_RDI);
    if (bVar2) {
      local_28 = 0;
      pcVar4 = "QReal";
    }
    else {
      local_28 = nameToBuiltinType(in_RDI);
      pcVar4 = metaTypeEnumValueString(local_28);
    }
    if (pcVar4 == (char *)0x0) {
      fprintf((FILE *)(in_RDI->d).ptr,"%4d",(ulong)local_28);
    }
    else {
      fprintf((FILE *)(in_RDI->d).ptr,"QMetaType::%s",pcVar4);
    }
  }
  else {
    __stream = (FILE *)(in_RDI->d).ptr;
    uVar3 = stridx((Generator *)__stream,in_stack_ffffffffffffffb8);
    fprintf(__stream,"0x%.8x | %d",0x80000000,(ulong)uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateTypeInfo(const QByteArray &typeName, bool allowEmptyName)
{
    Q_UNUSED(allowEmptyName);
    if (isBuiltinType(typeName)) {
        int type;
        const char *valueString;
        if (typeName == "qreal") {
            type = QMetaType::UnknownType;
            valueString = "QReal";
        } else {
            type = nameToBuiltinType(typeName);
            valueString = metaTypeEnumValueString(type);
        }
        if (valueString) {
            fprintf(out, "QMetaType::%s", valueString);
        } else {
            Q_ASSERT(type != QMetaType::UnknownType);
            fprintf(out, "%4d", type);
        }
    } else {
        Q_ASSERT(!typeName.isEmpty() || allowEmptyName);
        fprintf(out, "0x%.8x | %d", IsUnresolvedType, stridx(typeName));
    }
}